

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O0

void __thiscall QAbstractButtonPrivate::emitPressed(QAbstractButtonPrivate *this)

{
  long lVar1;
  bool bVar2;
  QAbstractButton *this_00;
  QAbstractButtonPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractButton *q;
  QPointer<QAbstractButton> guard;
  QAbstractButton *in_stack_ffffffffffffffc8;
  QAbstractButton *_t1;
  QAbstractButton *button;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = q_func(in_RDI);
  button = (QAbstractButton *)&DAT_aaaaaaaaaaaaaaaa;
  QPointer<QAbstractButton>::QPointer<void>
            ((QPointer<QAbstractButton> *)in_RDI,in_stack_ffffffffffffffc8);
  QAbstractButton::pressed((QAbstractButton *)0x4ff6c0);
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QAbstractButton> *)0x4ff6ca);
  if ((bVar2) && (in_RDI->group != (QButtonGroup *)0x0)) {
    _t1 = (QAbstractButton *)in_RDI->group;
    QButtonGroup::id((QButtonGroup *)this_00,button);
    QButtonGroup::idPressed((QButtonGroup *)0x4ff70b,(int)((ulong)_t1 >> 0x20));
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QAbstractButton> *)0x4ff715);
    if ((bVar2) && (in_RDI->group != (QButtonGroup *)0x0)) {
      QButtonGroup::buttonPressed((QButtonGroup *)0x4ff740,_t1);
    }
  }
  QPointer<QAbstractButton>::~QPointer((QPointer<QAbstractButton> *)0x4ff74c);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractButtonPrivate::emitPressed()
{
    Q_Q(QAbstractButton);
    QPointer<QAbstractButton> guard(q);
    emit q->pressed();
#if QT_CONFIG(buttongroup)
    if (guard && group) {
        emit group->idPressed(group->id(q));
        if (guard && group)
            emit group->buttonPressed(q);
    }
#endif
}